

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level.c
# Opt level: O0

void update_ref_buffers(DECODER_MODEL *decoder_model,int idx,int refresh_frame_flags)

{
  int pre_idx;
  int i;
  FRAME_BUFFER *this_buffer;
  int refresh_frame_flags_local;
  int idx_local;
  DECODER_MODEL *decoder_model_local;
  
  for (i = 0; i < 8; i = i + 1) {
    if ((refresh_frame_flags & 1 << ((byte)i & 0x1f)) != 0) {
      if (decoder_model->vbi[i] != -1) {
        decoder_model->frame_buffer_pool[decoder_model->vbi[i]].decoder_ref_count =
             decoder_model->frame_buffer_pool[decoder_model->vbi[i]].decoder_ref_count + -1;
      }
      decoder_model->vbi[i] = idx;
      decoder_model->frame_buffer_pool[idx].decoder_ref_count =
           decoder_model->frame_buffer_pool[idx].decoder_ref_count + 1;
    }
  }
  return;
}

Assistant:

static void update_ref_buffers(DECODER_MODEL *const decoder_model, int idx,
                               int refresh_frame_flags) {
  FRAME_BUFFER *const this_buffer = &decoder_model->frame_buffer_pool[idx];
  for (int i = 0; i < REF_FRAMES; ++i) {
    if (refresh_frame_flags & (1 << i)) {
      const int pre_idx = decoder_model->vbi[i];
      if (pre_idx != -1) {
        --decoder_model->frame_buffer_pool[pre_idx].decoder_ref_count;
      }
      decoder_model->vbi[i] = idx;
      ++this_buffer->decoder_ref_count;
    }
  }
}